

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_multigrad
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *grad,REF_INT p_norm,REF_DBL gradation,
          REF_DBL target_complexity)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  REF_DBL *grad_00;
  undefined4 extraout_var;
  REF_DBL *grad_01;
  undefined4 extraout_var_00;
  char *grad_02;
  long *plVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  long lVar10;
  size_t __size;
  REF_DBL *unaff_R15;
  
  pRVar2 = ref_grid->node;
  iVar5 = pRVar2->max;
  if ((long)iVar5 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x996,
           "ref_metric_multigrad","malloc dsdx of REF_DBL negative");
    __size = 1;
  }
  else {
    __size = (long)iVar5 * 8;
    unaff_R15 = (REF_DBL *)malloc(__size);
    if (unaff_R15 == (REF_DBL *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x996,"ref_metric_multigrad","malloc dsdx of REF_DBL NULL");
      __size = 2;
      unaff_R15 = (REF_DBL *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar5 != 0) {
        memset(unaff_R15,0,__size);
      }
    }
  }
  uVar6 = (uint)__size;
  if (bVar4) {
    uVar1 = pRVar2->max;
    if ((int)uVar1 < 0) {
      bVar4 = false;
      iVar5 = printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x997,"ref_metric_multigrad","malloc gradx of REF_DBL negative");
      grad_00 = (REF_DBL *)CONCAT44(extraout_var,iVar5);
      uVar6 = 1;
    }
    else {
      grad_00 = (REF_DBL *)malloc((ulong)uVar1 * 0x18);
      if (grad_00 == (REF_DBL *)0x0) {
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x997,"ref_metric_multigrad","malloc gradx of REF_DBL NULL");
        uVar6 = 2;
        grad_00 = (REF_DBL *)0x0;
      }
      else {
        bVar4 = true;
        if ((ulong)uVar1 != 0) {
          uVar9 = 1;
          if (1 < (int)(uVar1 * 3)) {
            uVar9 = (ulong)(uVar1 * 3);
          }
          memset(grad_00,0,uVar9 << 3);
        }
      }
    }
    if (bVar4) {
      uVar1 = pRVar2->max;
      if ((int)uVar1 < 0) {
        bVar4 = false;
        iVar5 = printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x998,"ref_metric_multigrad","malloc grady of REF_DBL negative");
        grad_01 = (REF_DBL *)CONCAT44(extraout_var_00,iVar5);
        uVar6 = 1;
      }
      else {
        grad_01 = (REF_DBL *)malloc((ulong)uVar1 * 0x18);
        if (grad_01 == (REF_DBL *)0x0) {
          bVar4 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x998,"ref_metric_multigrad","malloc grady of REF_DBL NULL");
          uVar6 = 2;
          grad_01 = (REF_DBL *)0x0;
        }
        else {
          bVar4 = true;
          if ((ulong)uVar1 != 0) {
            uVar9 = 1;
            if (1 < (int)(uVar1 * 3)) {
              uVar9 = (ulong)(uVar1 * 3);
            }
            memset(grad_01,0,uVar9 << 3);
          }
        }
      }
      if (bVar4) {
        uVar1 = pRVar2->max;
        if ((int)uVar1 < 0) {
          grad_02 = "%s: %d: %s: %s\n";
          bVar4 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x999,"ref_metric_multigrad","malloc gradz of REF_DBL negative");
          uVar6 = 1;
        }
        else {
          grad_02 = (char *)malloc((ulong)uVar1 * 0x18);
          if ((REF_DBL *)grad_02 == (REF_DBL *)0x0) {
            bVar4 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x999,"ref_metric_multigrad","malloc gradz of REF_DBL NULL");
            uVar6 = 2;
            grad_02 = (char *)0x0;
          }
          else {
            bVar4 = true;
            if ((ulong)uVar1 != 0) {
              uVar9 = 1;
              if (1 < (int)(uVar1 * 3)) {
                uVar9 = (ulong)(uVar1 * 3);
              }
              memset(grad_02,0,uVar9 << 3);
            }
          }
        }
        if (bVar4) {
          iVar5 = pRVar2->max;
          if (0 < (long)iVar5) {
            pRVar3 = pRVar2->global;
            lVar10 = 0;
            pRVar8 = grad;
            do {
              if (-1 < pRVar3[lVar10]) {
                unaff_R15[lVar10] = *pRVar8;
              }
              lVar10 = lVar10 + 1;
              pRVar8 = pRVar8 + 3;
            } while (iVar5 != lVar10);
          }
          uVar6 = ref_recon_l2_projection_grad(ref_grid,unaff_R15,grad_00);
          if (uVar6 == 0) {
            iVar5 = pRVar2->max;
            if (0 < (long)iVar5) {
              pRVar8 = grad + 1;
              pRVar3 = pRVar2->global;
              lVar10 = 0;
              do {
                if (-1 < pRVar3[lVar10]) {
                  unaff_R15[lVar10] = *pRVar8;
                }
                lVar10 = lVar10 + 1;
                pRVar8 = pRVar8 + 3;
              } while (iVar5 != lVar10);
            }
            uVar6 = ref_recon_l2_projection_grad(ref_grid,unaff_R15,grad_01);
            if (uVar6 == 0) {
              iVar5 = pRVar2->max;
              if (0 < (long)iVar5) {
                pRVar8 = grad + 2;
                pRVar3 = pRVar2->global;
                lVar10 = 0;
                do {
                  if (-1 < pRVar3[lVar10]) {
                    unaff_R15[lVar10] = *pRVar8;
                  }
                  lVar10 = lVar10 + 1;
                  pRVar8 = pRVar8 + 3;
                } while (iVar5 != lVar10);
              }
              uVar6 = ref_recon_l2_projection_grad(ref_grid,unaff_R15,(REF_DBL *)grad_02);
              if (uVar6 == 0) {
                iVar5 = pRVar2->max;
                if (0 < (long)iVar5) {
                  plVar7 = pRVar2->global;
                  lVar10 = 0;
                  do {
                    if (-1 < *plVar7) {
                      *(undefined8 *)((long)metric + lVar10 * 2) =
                           *(undefined8 *)((long)grad_00 + lVar10);
                      *(double *)((long)metric + lVar10 * 2 + 8) =
                           (*(double *)((long)grad_00 + lVar10 + 8) +
                           *(double *)((long)grad_01 + lVar10)) * 0.5;
                      *(double *)((long)metric + lVar10 * 2 + 0x10) =
                           (*(double *)((long)grad_00 + lVar10 + 0x10) +
                           *(double *)((long)grad_02 + lVar10)) * 0.5;
                      *(undefined8 *)((long)metric + lVar10 * 2 + 0x18) =
                           *(undefined8 *)((long)grad_01 + lVar10 + 8);
                      *(double *)((long)metric + lVar10 * 2 + 0x20) =
                           (*(double *)((long)grad_01 + lVar10 + 0x10) +
                           *(double *)((long)grad_02 + lVar10 + 8)) * 0.5;
                      *(undefined8 *)((long)metric + lVar10 * 2 + 0x28) =
                           *(undefined8 *)((long)grad_02 + lVar10 + 0x10);
                    }
                    plVar7 = plVar7 + 1;
                    lVar10 = lVar10 + 0x18;
                  } while ((long)iVar5 * 0x18 != lVar10);
                }
                if ((REF_DBL *)grad_02 != (REF_DBL *)0x0) {
                  free(grad_02);
                }
                if (grad_01 != (REF_DBL *)0x0) {
                  free(grad_01);
                }
                if (grad_00 != (REF_DBL *)0x0) {
                  free(grad_00);
                }
                if (unaff_R15 != (REF_DBL *)0x0) {
                  free(unaff_R15);
                }
                uVar6 = ref_recon_abs_value_hessian(ref_grid,metric);
                if (uVar6 == 0) {
                  uVar6 = ref_recon_roundoff_limit(metric,ref_grid);
                  if (uVar6 == 0) {
                    uVar6 = ref_metric_local_scale(metric,ref_grid,p_norm);
                    if (uVar6 == 0) {
                      uVar6 = ref_metric_gradation_at_complexity
                                        (metric,ref_grid,gradation,target_complexity);
                      if (uVar6 == 0) {
                        uVar6 = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x9bc,"ref_metric_multigrad",(ulong)uVar6,"gradation at complexity")
                        ;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x9b9,"ref_metric_multigrad",(ulong)uVar6,"local scale lp norm");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x9b8,"ref_metric_multigrad",(ulong)uVar6,
                           "floor metric eigenvalues based on grid size and solution jitter");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x9b5,"ref_metric_multigrad",(ulong)uVar6,"abs");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9a4,"ref_metric_multigrad",(ulong)uVar6,"gradz");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x9a0,"ref_metric_multigrad",(ulong)uVar6,"grady");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x99c,"ref_metric_multigrad",(ulong)uVar6,"gradx");
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_metric_multigrad(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *grad, REF_INT p_norm,
                                        REF_DBL gradation,
                                        REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL *dsdx, *gradx, *grady, *gradz;
  ref_malloc_init(dsdx, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradx, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grady, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradz, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  i = 0;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradx), "gradx");

  i = 1;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, grady), "grady");

  i = 2;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradz), "gradz");

  /* average off-diagonals */
  each_ref_node_valid_node(ref_node, node) {
    metric[0 + 6 * node] = gradx[0 + 3 * node];
    metric[1 + 6 * node] = 0.5 * (gradx[1 + 3 * node] + grady[0 + 3 * node]);
    metric[2 + 6 * node] = 0.5 * (gradx[2 + 3 * node] + gradz[0 + 3 * node]);
    metric[3 + 6 * node] = grady[1 + 3 * node];
    metric[4 + 6 * node] = 0.5 * (grady[2 + 3 * node] + gradz[1 + 3 * node]);
    metric[5 + 6 * node] = gradz[2 + 3 * node];
  }

  ref_free(gradz);
  ref_free(grady);
  ref_free(gradx);
  ref_free(dsdx);

  RSS(ref_recon_abs_value_hessian(ref_grid, metric), "abs");

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}